

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

int Bmcg_ManPerformOne(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint f;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Bmcg_Man_t *p;
  Cnf_Dat_t *pCnf;
  long lVar9;
  Abc_Cex_t *pAVar10;
  _func_void_int_int_int *p_Var11;
  int nClauses;
  int nClauses_00;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int local_7c;
  timespec ts;
  abctime local_68;
  int iLit;
  ulong local_40;
  Abc_Cex_t **local_38;
  
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    local_68 = -1;
  }
  else {
    local_68 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p = Bmcg_ManStart(pGia,pPars);
  local_38 = &pGia->pCexSeq;
  Abc_CexFreeP(local_38);
  if (pPars->nFramesMax < 0) {
    local_7c = -1;
    uVar14 = 0;
    iVar4 = 0;
  }
  else {
    local_7c = -1;
    uVar13 = 0;
    iVar4 = 0;
    do {
      iVar5 = (int)uVar13;
      pCnf = Bmcg_ManAddNewCnf(p,iVar5,pPars->nFramesAdd);
      if (pCnf == (Cnf_Dat_t *)0x0) {
        Bmcg_ManPrintFrame(p,iVar5,nClauses,-1,local_68);
        bVar3 = false;
        if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
          if (pPars->nFramesAdd < 1) {
            iVar4 = 0;
          }
          else {
            iVar4 = 0;
            do {
              if (pGia->nRegs < pGia->vCos->nSize) {
                iVar7 = 0;
                do {
                  (*pPars->pFuncOnFrameDone)(iVar4 + iVar5,iVar7,0);
                  iVar7 = iVar7 + 1;
                } while (iVar7 < pGia->vCos->nSize - pGia->nRegs);
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < pPars->nFramesAdd);
            bVar3 = false;
          }
        }
      }
      else {
        Bmcg_ManAddCnf(p,p->pSats[0],pCnf);
        Cnf_DataFree(pCnf);
        if (p->pFrames->vCos->nSize - p->pFrames->nRegs !=
            (pGia->vCos->nSize - pGia->nRegs) * (pPars->nFramesAdd + iVar5)) {
          __assert_fail("Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                        ,0x17a,"int Bmcg_ManPerformOne(Gia_Man_t *, Bmc_AndPar_t *)");
        }
        if (pPars->nFramesAdd < 1) {
          iVar4 = 0;
        }
        else {
          iVar4 = 0;
          local_40 = uVar13;
          do {
            if (pGia->nRegs < pGia->vCos->nSize) {
              f = iVar4 + (int)local_40;
              uVar14 = 0;
              do {
                iVar5 = clock_gettime(3,(timespec *)&ts);
                if (iVar5 < 0) {
                  lVar12 = 1;
                }
                else {
                  lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                uVar6 = (pGia->vCos->nSize - pGia->nRegs) * f + uVar14;
                if ((int)uVar6 < 0) {
LAB_00572af8:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                pVVar1 = p->pFrames->vCos;
                if (pVVar1->nSize <= (int)uVar6) goto LAB_00572af8;
                iVar5 = pVVar1->pArray[uVar6];
                if (((long)iVar5 < 0) || (p->pFrames->nObjs <= iVar5)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((p->vFr2Sat).nSize <= iVar5) goto LAB_00572af8;
                iVar5 = (p->vFr2Sat).pArray[iVar5];
                if (iVar5 < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                iLit = iVar5 * 2;
                if (pPars->nTimeOut == 0) {
LAB_005726f5:
                  iVar5 = bmcg_sat_solver_solve(p->pSats[0],&iLit,1);
                  iVar7 = clock_gettime(3,(timespec *)&ts);
                  if (iVar7 < 0) {
                    lVar9 = -1;
                  }
                  else {
                    lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  p->timeSat = p->timeSat + lVar9 + lVar12;
                  bVar3 = true;
                  if (iVar5 == 1) {
                    pPars->iFrame = f;
                    pAVar10 = Bmcg_ManGenerateCex(p,uVar14,f,0);
                    *local_38 = pAVar10;
                    pPars->nFailOuts = pPars->nFailOuts + 1;
                    Bmcg_ManPrintFrame(p,f,nClauses_00,-1,local_68);
                    if (pPars->fNotVerbose == 0) {
                      uVar6 = pGia->vCos->nSize - pGia->nRegs;
                      uVar13 = (ulong)uVar6;
                      if (1 < uVar6) {
                        uVar13 = 0;
                        uVar8 = uVar6 - 1;
                        if (uVar6 - 1 != 0) {
                          do {
                            uVar13 = (ulong)((int)uVar13 + 1);
                            bVar2 = 9 < uVar8;
                            uVar8 = uVar8 / 10;
                          } while (bVar2);
                        }
                      }
                      Abc_Print(uVar6,
                                "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  "
                                ,uVar13,(ulong)uVar14,(ulong)f,uVar13,(ulong)(uint)pPars->nFailOuts,
                                uVar13,(ulong)uVar6);
                      fflush(_stdout);
                    }
                    p_Var11 = pPars->pFuncOnFrameDone;
                    local_7c = 0;
                    if (p_Var11 != (_func_void_int_int_int *)0x0) {
                      iVar5 = 1;
LAB_00572885:
                      (*p_Var11)(f,uVar14,iVar5);
                    }
                  }
                  else if (iVar5 == -1) {
                    if (uVar14 == ~pGia->nRegs + pGia->vCos->nSize) {
                      Bmcg_ManPrintFrame(p,f,(int)(lVar9 + lVar12),-1,local_68);
                    }
                    p_Var11 = pPars->pFuncOnFrameDone;
                    bVar3 = false;
                    if (p_Var11 != (_func_void_int_int_int *)0x0) {
                      iVar5 = 0;
                      goto LAB_00572885;
                    }
                  }
                }
                else {
                  iVar5 = clock_gettime(3,(timespec *)&ts);
                  if (iVar5 < 0) {
                    lVar9 = -1;
                  }
                  else {
                    lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  bVar3 = true;
                  if ((lVar9 - local_68) / 1000000 < (long)pPars->nTimeOut) goto LAB_005726f5;
                }
              } while ((!bVar3) &&
                      (uVar14 = uVar14 + 1, (int)uVar14 < pGia->vCos->nSize - pGia->nRegs));
            }
            else {
              uVar14 = 0;
            }
            uVar13 = local_40;
          } while ((pGia->vCos->nSize - pGia->nRegs <= (int)uVar14) &&
                  ((iVar4 + (int)local_40 != pPars->nFramesMax + -1 &&
                   (iVar4 = iVar4 + 1, iVar4 < pPars->nFramesAdd))));
        }
        bVar3 = iVar4 < pPars->nFramesAdd;
      }
      uVar14 = (uint)uVar13;
      if (bVar3) break;
      uVar14 = uVar14 + pPars->nFramesAdd;
      uVar13 = (ulong)uVar14;
    } while ((int)uVar14 < pPars->nFramesMax || pPars->nFramesMax == 0);
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeOth = lVar12 - (p->timeUnf + local_68 + p->timeCnf + p->timeSmp + p->timeSat);
  if ((local_7c == -1) && (pPars->fNotVerbose == 0)) {
    iVar5 = iVar4 + 1;
    if (pPars->nFramesAdd <= iVar4) {
      iVar5 = 0;
    }
    printf("No output failed in %d frames.  ",(ulong)(iVar5 + uVar14));
  }
  iVar5 = 3;
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar12 - local_68) / 1000000.0);
  Bmcg_ManPrintTime(p);
  Bmcg_ManStop(p);
  return local_7c;
}

Assistant:

int Bmcg_ManPerformOne( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime clkStart = Abc_Clock();
    Bmcg_Man_t * p = Bmcg_ManStart( pGia, pPars );
    int f, k = 0, i = Gia_ManPoNum(pGia), status, RetValue = -1, nClauses = 0;
    Abc_CexFreeP( &pGia->pCexSeq );
    for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f += pPars->nFramesAdd )
    {
        Cnf_Dat_t * pCnf = Bmcg_ManAddNewCnf( p, f, pPars->nFramesAdd );
        if ( pCnf == NULL )
        {
            Bmcg_ManPrintFrame( p, f, nClauses, -1, clkStart );
            if( pPars->pFuncOnFrameDone )
                for ( k = 0; k < pPars->nFramesAdd; k++ )
                for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
                    pPars->pFuncOnFrameDone(f+k, i, 0);
            continue;
        }
        nClauses += pCnf->nClauses;
        Bmcg_ManAddCnf( p, p->pSats[0], pCnf );
        Cnf_DataFree( pCnf );
        assert( Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia) );
        for ( k = 0; k < pPars->nFramesAdd; k++ )
        {
            for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
            {
                abctime clk = Abc_Clock();
                int iObj = Gia_ObjId( p->pFrames, Gia_ManCo(p->pFrames, (f+k) * Gia_ManPoNum(pGia) + i) );
                int iLit = Abc_Var2Lit( Vec_IntEntry(&p->vFr2Sat, iObj), 0 );
                if ( pPars->nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->nTimeOut )
                    break;
                status = bmcg_sat_solver_solve( p->pSats[0], &iLit, 1 );
                p->timeSat += Abc_Clock() - clk;
                if ( status == -1 ) // unsat
                {
                    if ( i == Gia_ManPoNum(pGia)-1 )
                        Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if( pPars->pFuncOnFrameDone)
                        pPars->pFuncOnFrameDone(f+k, i, 0);
                    continue;
                }
                if ( status == 1 ) // sat
                {
                    RetValue = 0;
                    pPars->iFrame = f+k;
                    pGia->pCexSeq = Bmcg_ManGenerateCex( p, i, f+k, 0 );
                    pPars->nFailOuts++;
                    Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if ( !pPars->fNotVerbose )
                    {
                        int nOutDigits = Abc_Base10Log( Gia_ManPoNum(pGia) );
                        Abc_Print( 1, "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",  
                            nOutDigits, i, f+k, nOutDigits, pPars->nFailOuts, nOutDigits, Gia_ManPoNum(pGia) );
                        fflush( stdout );
                    }
                    if( pPars->pFuncOnFrameDone )
                        pPars->pFuncOnFrameDone(f+k, i, 1);
                }
                break;
            }
            if ( i < Gia_ManPoNum(pGia) || f+k == pPars->nFramesMax-1 )
                break;
        }
        if ( k < pPars->nFramesAdd )
            break;
    }
    p->timeOth = Abc_Clock() - clkStart - p->timeUnf - p->timeCnf - p->timeSmp - p->timeSat;
    if ( RetValue == -1 && !pPars->fNotVerbose )
        printf( "No output failed in %d frames.  ", f + (k < pPars->nFramesAdd ? k+1 : 0) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Bmcg_ManPrintTime( p );
    Bmcg_ManStop( p );
    return RetValue;
}